

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O0

int randomx::scheduleMop<false>(MacroOp *mop,type (*portBusy) [174] [3],int cycle,int depCycle)

{
  bool bVar1;
  type tVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int in_EDX;
  type (*in_RSI) [174] [3];
  MacroOp *in_RDI;
  int cycle2;
  int cycle1;
  int local_20;
  int local_1c;
  type (*local_18) [174] [3];
  MacroOp *local_10;
  int local_4;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  bVar1 = MacroOp::isDependent(in_RDI);
  if (bVar1) {
    piVar5 = std::max<int>(&local_1c,&local_20);
    local_1c = *piVar5;
  }
  bVar1 = MacroOp::isEliminated(local_10);
  if (bVar1) {
    local_4 = local_1c;
  }
  else {
    bVar1 = MacroOp::isSimple(local_10);
    if (bVar1) {
      tVar2 = MacroOp::getUop1(local_10);
      local_4 = scheduleUop<false>(tVar2,local_18,local_1c);
    }
    else {
      for (; local_1c < 0xae; local_1c = local_1c + 1) {
        tVar2 = MacroOp::getUop1(local_10);
        iVar3 = scheduleUop<false>(tVar2,local_18,local_1c);
        tVar2 = MacroOp::getUop2(local_10);
        iVar4 = scheduleUop<false>(tVar2,local_18,local_1c);
        if ((-1 < iVar3) && (iVar3 == iVar4)) {
          return iVar3;
        }
      }
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

static int scheduleMop(const MacroOp& mop, ExecutionPort::type(&portBusy)[CYCLE_MAP_SIZE][3], int cycle, int depCycle) {
		//if this macro-op depends on the previous one, increase the starting cycle if needed
		//this handles an explicit dependency chain in IMUL_RCP
		if (mop.isDependent()) {
			cycle = std::max(cycle, depCycle);
		}
		//move instructions are eliminated and don't need an execution unit
		if (mop.isEliminated()) {
			if (commit)
				if (trace) std::cout << "; (eliminated)" << std::endl;
			return cycle;
		} 
		else if (mop.isSimple()) {
			//this macro-op has only one uOP
			return scheduleUop<commit>(mop.getUop1(), portBusy, cycle);
		}
		else {
			//macro-ops with 2 uOPs are scheduled conservatively by requiring both uOPs to execute in the same cycle
			for (; cycle < CYCLE_MAP_SIZE; ++cycle) {

				int cycle1 = scheduleUop<false>(mop.getUop1(), portBusy, cycle);
				int cycle2 = scheduleUop<false>(mop.getUop2(), portBusy, cycle);

				if (cycle1 >= 0 && cycle1 == cycle2) {
					if (commit) {
						scheduleUop<true>(mop.getUop1(), portBusy, cycle1);
						scheduleUop<true>(mop.getUop2(), portBusy, cycle2);
					}
					return cycle1;
				}
			}
		}

		return -1;
	}